

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSpaceProgram::IfcSpaceProgram(IfcSpaceProgram *this)

{
  *(undefined ***)&this->field_0x148 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x150 = 0;
  *(char **)&this->field_0x158 = "IfcSpaceProgram";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__008af238);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8af158;
  *(undefined8 *)&this->field_0x148 = 0x8af220;
  *(undefined8 *)&this->field_0x88 = 0x8af180;
  *(undefined8 *)&this->field_0x98 = 0x8af1a8;
  *(undefined8 *)&this->field_0xd0 = 0x8af1d0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>)._vptr_ObjectHelper =
       (_func_int **)0x8af1f8;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>).field_0x20 = 0;
  (this->MaxRequiredArea).have = false;
  (this->MinRequiredArea).have = false;
  (this->RequestedLocation).ptr.obj = (LazyObject *)0x0;
  (this->RequestedLocation).have = false;
  return;
}

Assistant:

IfcSpaceProgram() : Object("IfcSpaceProgram") {}